

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                  (string *str,uint8 *target)

{
  uint32 value;
  ulong uVar1;
  LogMessage *other;
  uint8 *puVar2;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  uint8 *local_18;
  uint8 *target_local;
  string *str_local;
  
  local_18 = target;
  target_local = (uint8 *)str;
  uVar1 = std::__cxx11::string::size();
  local_51 = 0;
  if (0xffffffff < uVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x319);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (str.size()) <= (kuint32max): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  value = std::__cxx11::string::size();
  local_18 = WriteVarint32ToArray(value,local_18);
  puVar2 = WriteStringToArray((string *)target_local,local_18);
  return puVar2;
}

Assistant:

uint8* CodedOutputStream::WriteStringWithSizeToArray(const string& str,
                                                     uint8* target) {
  GOOGLE_DCHECK_LE(str.size(), kuint32max);
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}